

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int Curl_ossl_shutdown(connectdata *conn,int sockindex)

{
  Curl_easy *data;
  Curl_easy *data_00;
  int iVar1;
  ulong e;
  char *buf_00;
  uint *puVar2;
  bool bVar3;
  int local_14c;
  char buf [256];
  
  data = conn->data;
  if ((data->set).ftp_ccc == CURLFTPSSL_CCC_ACTIVE) {
    SSL_shutdown((SSL *)conn->ssl[sockindex].handle);
  }
  if (conn->ssl[sockindex].handle == (SSL *)0x0) {
    local_14c = 0;
  }
  else {
    bVar3 = true;
    local_14c = 0;
switchD_004c1e0f_caseD_0:
    if (bVar3) {
      iVar1 = Curl_socket_check(conn->sock[sockindex],-1,-1,10000);
      if (iVar1 < 1) {
        if (iVar1 == 0) {
          bVar3 = false;
          Curl_failf(data,"SSL shutdown timeout");
        }
        else {
          puVar2 = (uint *)__errno_location();
          bVar3 = false;
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar2);
          local_14c = -1;
        }
      }
      else {
        ERR_clear_error();
        iVar1 = SSL_read((SSL *)conn->ssl[sockindex].handle,buf,0x100);
        iVar1 = SSL_get_error((SSL *)conn->ssl[sockindex].handle,iVar1);
        bVar3 = false;
        switch(iVar1) {
        case 0:
        case 6:
          break;
        default:
          e = ERR_get_error();
          data_00 = conn->data;
          if (e == 0) {
            buf_00 = SSL_ERROR_to_str(iVar1);
          }
          else {
            buf_00 = buf;
            ERR_error_string_n(e,buf_00,0x100);
          }
          puVar2 = (uint *)__errno_location();
          bVar3 = false;
          Curl_failf(data_00,"OpenSSL SSL_read on shutdown: %s, errno %d",buf_00,(ulong)*puVar2);
          break;
        case 2:
          Curl_infof(data,"SSL_ERROR_WANT_READ\n");
          bVar3 = true;
          break;
        case 3:
          bVar3 = false;
          Curl_infof(data,"SSL_ERROR_WANT_WRITE\n");
        }
      }
      goto switchD_004c1e0f_caseD_0;
    }
    SSL_free((SSL *)conn->ssl[sockindex].handle);
    conn->ssl[sockindex].handle = (SSL *)0x0;
  }
  return local_14c;
}

Assistant:

int Curl_ossl_shutdown(struct connectdata *conn, int sockindex)
{
  int retval = 0;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct Curl_easy *data = conn->data;
  char buf[256]; /* We will use this for the OpenSSL error buffer, so it has
                    to be at least 256 bytes long. */
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  int err;
  int done = 0;

  /* This has only been tested on the proftpd server, and the mod_tls code
     sends a close notify alert without waiting for a close notify alert in
     response. Thus we wait for a close notify alert from the server, but
     we do not send one. Let's hope other servers do the same... */

  if(data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE)
      (void)SSL_shutdown(connssl->handle);

  if(connssl->handle) {
    buffsize = (int)sizeof(buf);
    while(!done) {
      int what = SOCKET_READABLE(conn->sock[sockindex],
                                 SSL_SHUTDOWN_TIMEOUT);
      if(what > 0) {
        ERR_clear_error();

        /* Something to read, let's do it and hope that it is the close
           notify alert from the server */
        nread = (ssize_t)SSL_read(conn->ssl[sockindex].handle, buf,
                                  buffsize);
        err = SSL_get_error(conn->ssl[sockindex].handle, (int)nread);

        switch(err) {
        case SSL_ERROR_NONE: /* this is not an error */
        case SSL_ERROR_ZERO_RETURN: /* no more data */
          /* This is the expected response. There was no data but only
             the close notify alert */
          done = 1;
          break;
        case SSL_ERROR_WANT_READ:
          /* there's data pending, re-invoke SSL_read() */
          infof(data, "SSL_ERROR_WANT_READ\n");
          break;
        case SSL_ERROR_WANT_WRITE:
          /* SSL wants a write. Really odd. Let's bail out. */
          infof(data, "SSL_ERROR_WANT_WRITE\n");
          done = 1;
          break;
        default:
          /* openssl/ssl.h says "look at error stack/return value/errno" */
          sslerror = ERR_get_error();
          failf(conn->data, OSSL_PACKAGE " SSL_read on shutdown: %s, errno %d",
                (sslerror ?
                 ossl_strerror(sslerror, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
          done = 1;
          break;
        }
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        done = 1;
      }
      else {
        /* anything that gets here is fatally bad */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        retval = -1;
        done = 1;
      }
    } /* while()-loop for the select() */

    if(data->set.verbose) {
#ifdef HAVE_SSL_GET_SHUTDOWN
      switch(SSL_get_shutdown(connssl->handle)) {
      case SSL_SENT_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN\n");
        break;
      case SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN\n");
        break;
      case SSL_SENT_SHUTDOWN|SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|"
              "SSL_RECEIVED__SHUTDOWN\n");
        break;
      }
#endif
    }

    SSL_free(connssl->handle);
    connssl->handle = NULL;
  }
  return retval;
}